

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
DensityCalculator<long_double,_float>::push_bdens_fast_route
          (DensityCalculator<long_double,_float> *this,double split_point,size_t col)

{
  pointer pdVar1;
  pointer pdVar2;
  iterator iVar3;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble local_78;
  longdouble local_68;
  double local_50;
  double local_48;
  longdouble local_3c;
  longdouble local_30;
  longdouble local_24;
  
  pdVar1 = (this->box_low).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->box_high).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (longdouble)pdVar2[col] - (longdouble)pdVar1[col];
  local_78 = ((longdouble)split_point - (longdouble)pdVar1[col]) / local_68;
  local_68 = ((longdouble)pdVar2[col] - (longdouble)split_point) / local_68;
  local_30 = (longdouble)2.2250738585072014e-308;
  local_50 = split_point;
  local_48 = split_point;
  local_24 = local_68;
  fmaxl();
  local_3c = (longdouble)0.9999999999999998;
  fminl();
  logl();
  iVar3._M_current =
       (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = iVar3._M_current[-1] + in_ST2;
  fmaxl();
  fminl();
  logl();
  local_68 = iVar3._M_current[-1] + in_ST3;
  if (iVar3._M_current ==
      (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<long_double,std::allocator<long_double>>::_M_realloc_insert<long_double_const&>
              ((vector<long_double,std::allocator<long_double>> *)this,iVar3,&local_68);
  }
  else {
    *iVar3._M_current = local_68;
    (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  iVar3._M_current =
       (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<long_double,std::allocator<long_double>>::_M_realloc_insert<long_double_const&>
              ((vector<long_double,std::allocator<long_double>> *)this,iVar3,&local_78);
  }
  else {
    *iVar3._M_current = local_78;
    (this->multipliers).super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  push_bdens_internal(this,local_50,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}